

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

void Curl_unencode_cleanup(Curl_easy *data)

{
  contenc_writer *local_20;
  contenc_writer *writer;
  SingleRequest *k;
  Curl_easy *data_local;
  
  local_20 = (data->req).writer_stack;
  while (local_20 != (contenc_writer *)0x0) {
    (data->req).writer_stack = local_20->downstream;
    (*local_20->handler->close_writer)(data,local_20);
    (*Curl_cfree)(local_20);
    local_20 = (data->req).writer_stack;
  }
  return;
}

Assistant:

void Curl_unencode_cleanup(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  struct contenc_writer *writer = k->writer_stack;

  while(writer) {
    k->writer_stack = writer->downstream;
    writer->handler->close_writer(data, writer);
    free(writer);
    writer = k->writer_stack;
  }
}